

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O1

State __thiscall
TileGate::_findNextStateAND
          (TileGate *this,State *adjacentStates,int numInputs,int numHigh,int numMiddle)

{
  State SVar1;
  
  if ((numInputs < 2) ||
     ((SVar1 = HIGH, numHigh != numInputs && (SVar1 = MIDDLE, numMiddle + numHigh != numInputs)))) {
    SVar1 = LOW;
  }
  return SVar1;
}

Assistant:

State TileGate::_findNextStateAND(State adjacentStates[4], int numInputs, int numHigh, int numMiddle) const {
    if (numInputs >= 2) {
        if (numHigh == numInputs) {
            return HIGH;
        } else if (numHigh + numMiddle == numInputs) {
            return MIDDLE;
        }
    }
    return LOW;
}